

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O3

void __thiscall strict_fstream::Exception::Exception(Exception *this,string *msg)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__Exception_00440660;
  (this->_msg)._M_dataplus._M_p = (pointer)&(this->_msg).field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_msg,pcVar1,pcVar1 + msg->_M_string_length);
  return;
}

Assistant:

Exception(const std::string& msg) : _msg(msg) {}